

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Endpoints.cpp
# Opt level: O2

bool soul::isMIDIEventEndpoint(EndpointDetails *details)

{
  bool bVar1;
  Type *type;
  
  bVar1 = false;
  if ((details->endpointType == event) && ((details->dataTypes).numActive == 1)) {
    type = ArrayWithPreallocation<choc::value::Type,_2UL>::front(&details->dataTypes);
    bVar1 = isMIDIMessageStruct(type);
    if (bVar1) {
      bVar1 = isConsoleEndpoint(&details->name);
      bVar1 = !bVar1;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool isMIDIEventEndpoint (const EndpointDetails& details)
{
    return isEvent (details)
            && details.dataTypes.size() == 1
            && isMIDIMessageStruct (details.dataTypes.front())
            && ! isConsoleEndpoint (details.name);
}